

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O2

int __thiscall regex_scan_frame::is_recursing(regex_scan_frame *this)

{
  re_state_id *prVar1;
  
  prVar1 = &this->st;
  do {
    this = this->parent;
    if (this == (regex_scan_frame *)0x0) break;
  } while (this->st != *prVar1);
  return (uint)(this != (regex_scan_frame *)0x0);
}

Assistant:

int is_recursing()
    {
        /* search up the parent chain for a duplicate of my state */
        for (regex_scan_frame *fr = parent ; fr != 0 ; fr = fr->parent)
        {
            if (fr->st == st)
                return TRUE;
        }

        /* didn't find it */
        return FALSE;
    }